

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O0

void __thiscall tonk::SDKConnection::SetSelfReference(SDKConnection *this)

{
  shared_ptr<tonk::SDKConnection> *in_RDI;
  enable_shared_from_this<tonk::SDKConnection> *in_stack_ffffffffffffffd8;
  
  std::enable_shared_from_this<tonk::SDKConnection>::shared_from_this(in_stack_ffffffffffffffd8);
  std::shared_ptr<tonk::SDKConnection>::operator=
            (in_RDI,(shared_ptr<tonk::SDKConnection> *)in_stack_ffffffffffffffd8);
  std::shared_ptr<tonk::SDKConnection>::~shared_ptr((shared_ptr<tonk::SDKConnection> *)0x11fabe);
  return;
}

Assistant:

void SetSelfReference()
    {
        SelfReference = shared_from_this();
    }